

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_svg_1.0.0.hpp
# Opt level: O0

void __thiscall svg::Color::Color(Color *this,Defaults color)

{
  Defaults color_local;
  Color *this_local;
  
  Serializeable::Serializeable(&this->super_Serializeable);
  (this->super_Serializeable)._vptr_Serializeable = (_func_int **)&PTR__Color_0012bca8;
  this->transparent = false;
  this->red = 0;
  this->green = 0;
  this->blue = 0;
  switch(color) {
  case Aqua:
    assign(this,0,0xff,0xff);
    break;
  case Black:
    assign(this,0,0,0);
    break;
  case Blue:
    assign(this,0,0,0xff);
    break;
  case Brown:
    assign(this,0xa5,0x2a,0x2a);
    break;
  case Cyan:
    assign(this,0,0xff,0xff);
    break;
  case Fuchsia:
    assign(this,0xff,0,0xff);
    break;
  case Green:
    assign(this,0,0x80,0);
    break;
  case Lime:
    assign(this,0,0xff,0);
    break;
  case Magenta:
    assign(this,0xff,0,0xff);
    break;
  case Orange:
    assign(this,0xff,0xa5,0);
    break;
  case Purple:
    assign(this,0x80,0,0x80);
    break;
  case Red:
    assign(this,0xff,0,0);
    break;
  case Silver:
    assign(this,0xc0,0xc0,0xc0);
    break;
  case White:
    assign(this,0xff,0xff,0xff);
    break;
  case Yellow:
    assign(this,0xff,0xff,0);
    break;
  default:
    this->transparent = true;
  }
  return;
}

Assistant:

Color(Defaults color)
            : transparent(false), red(0), green(0), blue(0)
        {
            switch (color)
            {
                case Aqua: assign(0, 255, 255); break;
                case Black: assign(0, 0, 0); break;
                case Blue: assign(0, 0, 255); break;
                case Brown: assign(165, 42, 42); break;
                case Cyan: assign(0, 255, 255); break;
                case Fuchsia: assign(255, 0, 255); break;
                case Green: assign(0, 128, 0); break;
                case Lime: assign(0, 255, 0); break;
                case Magenta: assign(255, 0, 255); break;
                case Orange: assign(255, 165, 0); break;
                case Purple: assign(128, 0, 128); break;
                case Red: assign(255, 0, 0); break;
                case Silver: assign(192, 192, 192); break;
                case White: assign(255, 255, 255); break;
                case Yellow: assign(255, 255, 0); break;
                default: transparent = true; break;
            }
        }